

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O2

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_1
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint32_t *__k;
  map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
  *this_02;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *this_03;
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  bool bVar5;
  uint32_t uVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  uint *puVar9;
  reference puVar10;
  ostream *poVar11;
  uint32_t uVar12;
  uint uVar13;
  ulong uVar14;
  R10_Decoder *pRVar15;
  int iVar16;
  pointer pVVar17;
  int i_1;
  ulong uVar18;
  Inter_Symbol_Generator *pIVar19;
  int iVar20;
  pointer puVar21;
  Row_Edge chosenRow;
  uint local_1dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> nonZeros_pos;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_188;
  ulong local_180;
  undefined1 local_178 [128];
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_f8;
  pointer local_f0;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_e8;
  pointer local_e0;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d8;
  matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_c8;
  matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  undefined1 local_90 [48];
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  this_00 = &this->c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,(ulong)D->L);
  this_01 = &this->d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_01,(ulong)*M);
  puVar21 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  while( true ) {
    uVar18 = (ulong)D->L;
    if (uVar18 <= uVar14) break;
    puVar21[uVar14] = (uint)uVar14;
    puVar4[uVar14] = (uint)uVar14;
    uVar14 = uVar14 + 1;
  }
  puVar9 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start + (int)D->L;
  while (uVar13 = (uint)uVar18, uVar13 < *M) {
    *puVar9 = uVar13;
    puVar9 = puVar9 + 1;
    uVar18 = (ulong)(uVar13 + 1);
  }
  __k = &this->A_i;
  this->A_i = 0;
  this->A_u = 0;
  this_02 = &this->rows;
  for (pIVar19 = (Inter_Symbol_Generator *)0x0; pIVar19 < (Inter_Symbol_Generator *)(ulong)*M;
      pIVar19 = (Inter_Symbol_Generator *)((long)&pIVar19->G_LDPC + 1)) {
    pRVar15 = (R10_Decoder *)&stack0xffffffffffffffb8;
    local_178._0_8_ = A;
    local_178._8_8_ = pIVar19;
    boost::numeric::ublas::
    vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
    ::
    vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                *)&stack0xffffffffffffffb8,
               (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_178);
    uVar6 = nonZeros_In_Row(pRVar15,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     *)&stack0xffffffffffffffb8,0,D->L - 1);
    boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
    ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &stack0xffffffffffffffb8);
    local_178._0_4_ = (uint32_t)pIVar19;
    pmVar7 = std::
             map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
             ::operator[](this_02,(key_type *)local_178);
    pmVar7->position = (uint32_t)pIVar19;
    pmVar7->nonZeros = uVar6;
    pmVar7->originalDegree = uVar6;
  }
  local_178._120_8_ = &this->util;
  do {
    uVar6 = this->A_i;
    if (this->A_u + uVar6 == D->L) {
      Indecoding_phase_2((Array_Data_Symbol *)local_178,this,A,D,M);
      Array_Data_Symbol::operator=(__return_storage_ptr__,(Array_Data_Symbol *)local_178);
      Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)local_178);
      return __return_storage_ptr__;
    }
    uVar14 = (ulong)(D->L + 1);
    local_1dc = 0x100001;
    bVar5 = true;
    for (uVar18 = (ulong)(int)uVar6; uVar12 = (uint32_t)uVar14,
        uVar18 < (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count; uVar18 = uVar18 + 1)
    {
      local_178._0_4_ = uVar6;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,(key_type *)local_178);
      uVar1 = pmVar7->nonZeros;
      local_178._0_4_ = uVar6;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,(key_type *)local_178);
      bVar5 = (bool)(uVar1 == 0 & bVar5);
      if (pmVar7->nonZeros == 2) {
        local_178._0_4_ = uVar6;
        pmVar7 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_02,(key_type *)local_178);
        chosenRow.originalDegree = pmVar7->originalDegree;
        chosenRow.position = pmVar7->position;
        chosenRow.nonZeros = pmVar7->nonZeros;
        if (bVar5) goto LAB_0010f3c2;
        uVar12 = chosenRow.nonZeros;
        goto LAB_0010ef2d;
      }
      local_178._0_4_ = uVar6;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,(key_type *)local_178);
      if ((pmVar7->nonZeros < uVar12) &&
         (nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = uVar6,
         pmVar7 = std::
                  map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                  ::operator[](this_02,(key_type *)&nonZeros_pos), pmVar7->nonZeros != 0)) {
        local_178._0_4_ = uVar6;
        pmVar7 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_02,(key_type *)local_178);
        chosenRow.originalDegree = pmVar7->originalDegree;
        chosenRow.position = pmVar7->position;
        chosenRow.nonZeros = pmVar7->nonZeros;
        uVar14 = (ulong)chosenRow._0_8_ >> 0x20;
        local_1dc = chosenRow.originalDegree;
      }
      else {
        local_178._0_4_ = uVar6;
        pmVar7 = std::
                 map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                 ::operator[](this_02,(key_type *)local_178);
        if ((pmVar7->nonZeros == uVar12) &&
           (nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = uVar6,
           pmVar7 = std::
                    map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                    ::operator[](this_02,(key_type *)&nonZeros_pos),
           pmVar7->originalDegree < local_1dc)) {
          pmVar7 = std::
                   map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
                   ::operator[](this_02,(key_type *)local_178);
          chosenRow.originalDegree = pmVar7->originalDegree;
          chosenRow.position = pmVar7->position;
          chosenRow.nonZeros = pmVar7->nonZeros;
          local_1dc = chosenRow.originalDegree;
        }
      }
      uVar6 = uVar6 + 1;
    }
    if (bVar5) {
LAB_0010f3c2:
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero."
                               );
      std::endl<char,std::char_traits<char>>(poVar11);
      exit(-1);
    }
LAB_0010ef2d:
    pIVar19 = (Inter_Symbol_Generator *)(chosenRow._0_8_ & 0xffffffff);
    local_178._8_8_ = ZEXT48(*__k);
    if (chosenRow.position != *__k) {
      local_178._0_8_ = A;
      local_b8.data_.e_ = A;
      local_b8.i_ = (size_type)pIVar19;
      boost::numeric::ublas::
      matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::swap((matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_178,&local_b8);
      puVar21 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = puVar21[*__k];
      puVar21[*__k] = puVar21[chosenRow._0_8_ & 0xffffffff];
      puVar21[chosenRow._0_8_ & 0xffffffff] = uVar13;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,__k);
      pmVar8 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,&chosenRow.position);
      uVar6 = pmVar7->originalDegree;
      local_178._8_4_ = uVar6;
      local_178._0_8_ = *(undefined8 *)pmVar7;
      pmVar7->originalDegree = pmVar8->originalDegree;
      uVar1 = pmVar8->nonZeros;
      pmVar7->position = pmVar8->position;
      pmVar7->nonZeros = uVar1;
      pmVar8->originalDegree = uVar6;
      *(undefined8 *)pmVar8 = local_178._0_8_;
      uVar6 = chosenRow.position;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,&chosenRow.position);
      pmVar7->position = uVar6;
      uVar6 = *__k;
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,__k);
      pmVar7->position = uVar6;
      pIVar19 = (Inter_Symbol_Generator *)(ulong)*__k;
    }
    pRVar15 = (R10_Decoder *)local_178;
    local_178._0_8_ = A;
    local_178._8_8_ = pIVar19;
    boost::numeric::ublas::
    vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
    ::
    vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
              ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_60,
               (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_178);
    find_nonZeros_pos_In_Row
              (&nonZeros_pos,pRVar15,
               (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_60,this->A_i,~this->A_u + D->L);
    boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
    ~unbounded_array(&local_60);
    puVar9 = (uint *)CONCAT44(nonZeros_pos.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              nonZeros_pos.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    pVVar17 = (pointer)(ulong)*puVar9;
    if (*__k != *puVar9) {
      local_178._0_8_ = A;
      local_178._8_8_ = (Inter_Symbol_Generator *)(ulong)*__k;
      local_c8.data_.e_ = A;
      local_c8.j_ = (size_type)pVVar17;
      boost::numeric::ublas::
      matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::swap((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_178,&local_c8);
      puVar21 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = puVar21[*__k];
      puVar21[*__k] = puVar21[(long)pVVar17];
      puVar21[(long)pVVar17] = uVar13;
      puVar9 = (uint *)CONCAT44(nonZeros_pos.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint32_t)
                                nonZeros_pos.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
    uVar13 = this->A_u;
    uVar6 = D->L;
    iVar16 = (int)((ulong)((long)nonZeros_pos.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar9) >> 2);
    for (iVar20 = 0; 0 < iVar16 + -1 + iVar20; iVar20 = iVar20 + -1) {
      uVar3 = iVar20 + ~uVar13 + uVar6;
      uVar2 = *(uint *)(CONCAT44(nonZeros_pos.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint32_t)
                                 nonZeros_pos.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) +
                       (ulong)(iVar20 + iVar16 + -1 & 0x7fffffff) * 4);
      pIVar19 = (Inter_Symbol_Generator *)(ulong)uVar2;
      if (uVar3 != uVar2) {
        pVVar17 = (pointer)(ulong)uVar3;
        local_178._0_8_ = A;
        local_178._8_8_ = pIVar19;
        local_d8.data_.e_ = A;
        local_d8.j_ = (size_type)pVVar17;
        boost::numeric::ublas::
        matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::swap((matrix_column<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)local_178,&local_d8);
        puVar21 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        uVar3 = puVar21[(long)pIVar19];
        puVar21[(long)pIVar19] = puVar21[(long)pVVar17];
        puVar21[(long)pVVar17] = uVar3;
      }
    }
    uVar13 = *__k;
    while (uVar13 = uVar13 + 1, uVar13 < *M) {
      puVar21 = (pointer)(long)(int)uVar13;
      puVar10 = boost::numeric::ublas::
                matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at_element(A,(size_type)puVar21,(ulong)*__k);
      if (*puVar10 != '\0') {
        local_180 = (ulong)*__k;
        this_03 = (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                  (local_90 + 0x18);
        local_188 = A;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::
        vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                    *)this_03,
                   (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_188);
        local_e8 = A;
        local_e0 = puVar21;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::
        vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                  ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_a8,
                   (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_e8);
        Utility::matrix_row_XOR
                  ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_178,(Utility *)local_178._120_8_,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)this_03,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_a8);
        local_f8 = A;
        local_f0 = puVar21;
        boost::numeric::ublas::
        matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
        ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                     *)&local_f8,
                    (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)local_178);
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_178
                        );
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        ~unbounded_array(&local_a8);
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        ~unbounded_array(this_03);
        puVar4 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar17 = (D->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        Vector_Data_DEF::operator^
                  ((Vector_Data_DEF *)local_178,pVVar17 + puVar4[(long)puVar21],
                   pVVar17 + puVar4[*__k]);
        Vector_Data_DEF::operator=
                  ((D->symbol).super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[(long)puVar21],
                   (Vector_Data_DEF *)local_178);
        Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)local_178);
      }
    }
    uVar6 = this->A_i + 1;
    this->A_i = uVar6;
    this->A_u = (this->A_u + uVar12) - 1;
    for (pIVar19 = (Inter_Symbol_Generator *)(long)(int)uVar6;
        pIVar19 < (Inter_Symbol_Generator *)
                  (this->rows)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pIVar19 = (Inter_Symbol_Generator *)((long)&pIVar19->G_LDPC + 1)) {
      pRVar15 = (R10_Decoder *)local_90;
      local_178._0_8_ = A;
      local_178._8_8_ = pIVar19;
      boost::numeric::ublas::
      vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
      ::
      vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  *)local_90,
                 (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)local_178);
      uVar6 = nonZeros_In_Row(pRVar15,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)local_90,this->A_i,~this->A_u + D->L);
      local_188 = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT44(local_188._4_4_,(int)pIVar19);
      pmVar7 = std::
               map<unsigned_int,_Row_Edge,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Row_Edge>_>_>
               ::operator[](this_02,(key_type *)&local_188);
      pmVar7->nonZeros = uVar6;
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      ~unbounded_array((unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&nonZeros_pos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  } while( true );
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_1(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{

	uint32_t r = 0;


	class Array_Data_Symbol result;

	//printf("D.L : %d\n", D.L);

	c.resize(D.L);
	d.resize(M);

	for (int i = 0; i < D.L; i++)
	{
		c[i] = i;
		d[i] = i;
	}

	for (int i = D.L; i < M; i++)
	{
		d[i] = i;
	}

	A_i = 0;
	A_u = 0;




	//std::cout << "nonZeros: " << std::endl;
	for (int i = 0; i < M; i++)
	{
		class Row_Edge tmp;
		tmp.nonZeros = nonZeros_In_Row(row(A, i), 0, D.L - 1);
		tmp.originalDegree = tmp.nonZeros;
		tmp.position = i;		
		rows[i] = tmp;

		//printf("%d ", rows[i].nonZeros);
	}
//	std::cout << std::endl;



    // counts how many rows have been chosen already
    //uint32_t chosenRowsCounter = 0;

/*
	Let r be the minimum integer such that at least one row of A has exactly r ones in V.

      *  If r != 2, then choose a row with exactly r ones in V with
         minimum original degree among all such rows.

      *  If r = 2, then choose any row with exactly 2 ones in V that is
         part of a maximum size component in the graph defined by V.
*/

    while((A_i + A_u) !=  D.L)
    {

    	class Row_Edge chosenRow;
		bool allZeros = true;
		uint32_t minDegree = 1048576 + 1;

    	r = D.L + 1;




    	for (int i = A_i; i < rows.size() ; i++)
    	{
    		if (rows[i].nonZeros != 0)
    		{
    			allZeros = false;
    		}


    		if (rows[i].nonZeros == 2)
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;

    		//	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    			break;
    		}


    		if ((rows[i].nonZeros < r) && (rows[i].nonZeros > 0) )
    		{
    			chosenRow = rows[i];
    			r = chosenRow.nonZeros;
    			minDegree = chosenRow.originalDegree;
    			    	//		printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    		else if ((rows[i].nonZeros == r) && rows[i].originalDegree < minDegree)
    		{
    			chosenRow = rows[i];
    			minDegree = chosenRow.originalDegree;
    			    //			printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

    		}
    	}

    	// there need to recode. I just do it for the testing version!!
    	if (allZeros == true)
    	{
    		std::cout << "Decoding Failure - PI Decoding  Phase 1: All entries in V are zero." << std::endl;
    		exit(-1);
    	}

//    	printf("chosenRow pos: %d nonZeros: %d\n", chosenRow.position, chosenRow.nonZeros);

/*
	After the row is chosen in this step the first row of A that intersects V is exchanged with the chosen row so that the chosen row is the first row that intersects V.  

*/

		if (chosenRow.position != A_i)
			{

				//swap rows of A
				row(A, A_i).swap(row(A, chosenRow.position));

				//swap symbol in d according to A operation
				std::swap(d[A_i], d[chosenRow.position]);

				// update rows map
				// printf(" size of rows : %d pos: %d deg: %d\n", rows.size(), rows[A_i].position, rows[A_i].originalDegree);
				std::swap(rows[A_i], rows[chosenRow.position]);

				rows[chosenRow.position].position = chosenRow.position;

				rows[A_i].position = A_i;

				// printf(" size of rows : %d  pos: %d deg: %d\n", rows.size(), rows[chosenRow.position].position, rows[chosenRow.position].originalDegree);
	
			}	

	//	matrix_print(A);	



	/*
 	The columns of A among those that intersect V are reordered so that one of the r ones in the chosen row appears in the first column of V and so that the remaining r-1 ones appear in the last columns of V.
	*/
 		//caculate the  non-zeros bits position in A_i row of A
 		std::vector<uint32_t> nonZeros_pos = find_nonZeros_pos_In_Row(ublas::row(A, A_i), A_i, D.L - 1 - A_u);

 		// std::cout << "nonZeros position: " << std::endl;
 		// for (int i = 0; i < nonZeros_pos.size(); i++)
 		// {
 		// 	printf("%d ", nonZeros_pos[i]);
 		// }

 	//	std::cout << std::endl << std::endl;

 		uint32_t _1st_nonZeros_pos = nonZeros_pos[0];

 		if (A_i != _1st_nonZeros_pos)
 		{
 			ublas::column(A, A_i).swap(ublas::column(A, _1st_nonZeros_pos));

 			std::swap(c[A_i], c[_1st_nonZeros_pos]);
	 	
	 	}

	 // 	std::cout << "find_nonZeros_pos_In_Row A swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	


		// swap the remaining non-zeros columns so that they are r-1 ones appear in the last columns of V
		uint32_t last_col = D.L - A_u - 1;
		for (int i = (nonZeros_pos.size() - 1); i > 0 ; i--)
		{
			// we need to know if the current column is the last column of V.
			uint32_t current_col = nonZeros_pos[i];
			if (current_col != last_col)
			{
				//if no, swap the current columns
				ublas::column(A, current_col).swap(ublas::column(A, last_col));

				std::swap(c[current_col], c[last_col]);

			}
			// move the last column of V
			last_col--;
		}
	 // 	std::cout << "remaining non-zeros of V swap: " << std::endl;
		
		// for (int i = 0; i < c.size(); ++i)
		// {
		// 	printf("%d ", c[i]);
		// }

		// std::cout << std::endl;

		// matrix_print(A);	





	/*
	Then, the chosen row is exclusive-ORed into all the other rows of A below the chosen row that have a one in the first column of V. 
	*/

		for (int _row = A_i + 1; _row < M; _row++)
		{
			//check if the A_ith column if '0'
			if (A(_row, A_i) == 0)
			{
				continue;
			}

			// using chosen rows XOR with remaining in A
			ublas::row(A, _row) = util.matrix_row_XOR(ublas::row(A, A_i), ublas::row(A, _row));
			// decoding process XOR D[d[row]] and D[d[i]]
	//		printf("symbol size: %d  row: %d  A_i: %d \n",D.symbol.size(), _row, A_i);


				D.symbol[d[_row]] = D.symbol[d[_row]] ^ D.symbol[d[A_i]];

			// for (int i = 0; i < D.sym_len; ++i)
			// {
			// 	D.symbol[_row].s[i] = D.symbol[_row].s[i] ^ D.symbol[A_i].s[i];
			// }

		}

	 //  	std::cout << "A XOR :  A_u: " <<  A_u << " A_i: "<<  A_i << std::endl;

		// matrix_print(A);	

	/*
	Finally, i is incremented by 1 and u is incremented by r-1, which completes the step.
	*/

    	A_i++;
 	   	A_u += r - 1;

	//  	std::cout << "A_u: " << A_u << " A_i: "<<  A_i << std::endl; 	   	

 	   	// update non-zeros
 	   	// std::cout << "position: " << std::endl;
 	   	// for (int i = 0; i < rows.size(); ++i)
 	   	// {
 	   	// 	printf("%d ", rows[i].position);
 	   	// }
 	   	// std::cout << std::endl;


	//	std::cout << "updated nonZeros: " << std::endl;
		for (int i = A_i; i < rows.size(); i++)
		{
			//uint32_t nzpos = rows[i].position;
			rows[i].nonZeros = nonZeros_In_Row(row(A, i), A_i, D.L - A_u - 1);
			//printf("%d:%d ",rows[i].position, rows[i].nonZeros);
		}
		//std::cout << std::endl;


    }



	result = Indecoding_phase_2(A, D, M);

    return result;

}